

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall Catch::RunningTest::addSection(RunningTest *this,string *name)

{
  bool bVar1;
  RunningSection *pRVar2;
  
  if (this->m_runStatus == NothingRun) {
    this->m_runStatus = EncounteredASection;
  }
  pRVar2 = RunningSection::findOrAddSubSection(this->m_currentSection,name,&this->m_changed);
  if (((this->m_runStatus & ~EncounteredASection) == RanAtLeastOneSection) ||
     (2 < (int)pRVar2->m_state)) {
    bVar1 = false;
  }
  else {
    this->m_currentSection = pRVar2;
    this->m_lastSectionToRun = (RunningSection *)0x0;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool addSection( std::string const& name ) {
            if( m_runStatus == NothingRun )
                m_runStatus = EncounteredASection;

            RunningSection* thisSection = m_currentSection->findOrAddSubSection( name, m_changed );

            if( !wasSectionSeen() && thisSection->shouldRun() ) {
                m_currentSection = thisSection;
                m_lastSectionToRun = NULL;
                return true;
            }
            return false;
        }